

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O3

void __thiscall
Omega_h::Future<int>::Future
          (Future<int> *this,Read<int> *sendbuf,Write<int> *recvbuf,requests_type *requests,
          callback_type *callback)

{
  Alloc *pAVar1;
  
  pAVar1 = (sendbuf->write_).shared_alloc_.alloc;
  (this->sendbuf_).write_.shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->sendbuf_).write_.shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (this->sendbuf_).write_.shared_alloc_.direct_ptr = (sendbuf->write_).shared_alloc_.direct_ptr;
  pAVar1 = (recvbuf->shared_alloc_).alloc;
  (this->recvbuf_).shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->recvbuf_).shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (this->recvbuf_).shared_alloc_.direct_ptr = (recvbuf->shared_alloc_).direct_ptr;
  std::function<Omega_h::Read<int>_(Omega_h::Write<int>)>::function(&this->callback_,callback);
  std::vector<int,_std::allocator<int>_>::vector(&this->requests_,requests);
  this->status_ = waiting;
  return;
}

Assistant:

Future<T>::Future(Read<T> sendbuf, Write<T> recvbuf,
    const requests_type&& requests, const callback_type callback)
    : sendbuf_(sendbuf),
      recvbuf_(recvbuf),
      callback_(callback),
      requests_(requests),
      status_(Status::waiting) {}